

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

void __thiscall Company::gift(Company *this)

{
  int iVar1;
  string *psVar2;
  Employee *pEVar3;
  long lVar4;
  string local_50;
  
  lVar4 = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployees(this->boss);
    if (iVar1 <= lVar4) break;
    psVar2 = Person::getId_abi_cxx11_(&this->employeeArray[lVar4]->super_Person);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)psVar2);
    iVar1 = std::__cxx11::stoi(&local_50,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_50);
    if (iVar1 < 0x5a) {
      pEVar3 = this->employeeArray[lVar4];
      iVar1 = Employee::getHourWork(pEVar3);
      Employee::setHourWork(pEVar3,iVar1 + 5);
    }
    lVar4 = lVar4 + 1;
  }
  pEVar3 = maxEfficiency(this);
  iVar1 = Employee::getHourWork(pEVar3);
  Employee::setHourWork(pEVar3,iVar1 + 10);
  return;
}

Assistant:

void Company::gift() {
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        if (stoi(employeeArray[i]->getId().substr(0, 2)) < 90)
            employeeArray[i]->setHourWork(employeeArray[i]->getHourWork() + 5);
    }
    Employee* em=maxEfficiency();//em= employeeArray max
     em->setHourWork(em->getHourWork()+10);
}